

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip.c
# Opt level: O0

int zip_entry_close(zip_t *zip)

{
  ulong uVar1;
  long lVar2;
  mz_uint64 uncomp_size;
  long lVar3;
  mz_uint32 mVar4;
  mz_bool mVar5;
  size_t sVar6;
  size_t sVar7;
  mz_file_needs_keepalive *local_160;
  mz_uint64 *local_150;
  mz_zip_type *local_140;
  undefined1 local_128;
  undefined1 local_127;
  undefined1 local_126;
  undefined1 local_125;
  mz_uint32 local_dir_footer_size;
  mz_uint8 local_dir_footer [24];
  mz_uint8 local_108 [8];
  mz_uint8 extra_data [28];
  mz_uint32 extra_size;
  mz_uint8 *pExtra_data;
  mz_uint16 local_ce;
  int err;
  tdefl_status tStack_c8;
  mz_uint16 dos_date;
  mz_uint16 dos_time;
  mz_uint16 entrylen;
  tdefl_status done;
  mz_uint level;
  mz_zip_archive *pzip;
  zip_t *zip_local;
  mz_uint32 *local_a8;
  undefined4 local_9c;
  undefined1 *local_98;
  undefined8 local_90;
  mz_uint8 *local_88;
  undefined4 local_7c;
  mz_uint8 *local_78;
  undefined4 local_6c;
  mz_uint8 *local_68;
  mz_uint64 local_60;
  mz_uint8 *local_58;
  undefined4 local_4c;
  mz_uint8 *local_48;
  undefined4 local_3c;
  mz_uint8 *local_38;
  
  _done = (zip_t *)0x0;
  err._0_2_ = 0;
  local_ce = 0;
  pExtra_data._4_4_ = 0;
  pzip = &zip->archive;
  if (zip == (zip_t *)0x0) {
    pExtra_data._4_4_ = -1;
  }
  else {
    _done = zip;
    if ((zip->archive).m_zip_mode != MZ_ZIP_MODE_READING) {
      _dos_time = zip->level & 0xf;
      if (_dos_time != 0) {
        tStack_c8 = tdefl_compress_buffer(&(zip->entry).comp,"",0,TDEFL_FINISH);
        if ((tStack_c8 != TDEFL_STATUS_DONE) && (tStack_c8 != TDEFL_STATUS_OKAY)) {
          pExtra_data._4_4_ = -0xc;
          goto LAB_0011fc85;
        }
        pzip[1].m_file_offset_alignment = pzip[2].m_central_directory_file_ofs;
        pzip[1].m_pFree = (mz_free_func)pzip[2].m_archive_size;
        *(undefined2 *)&pzip[1].m_pIO_opaque = 8;
      }
      sVar6 = strlen(*(char **)&pzip[1].m_total_files);
      err._2_2_ = (ushort)sVar6;
      mz_zip_time_t_to_dos_time((time_t)pzip[0xb25].m_pAlloc_opaque,(mz_uint16 *)&err,&local_ce);
      local_98 = &local_128;
      local_9c = 0x8074b50;
      local_128 = 0x50;
      local_127 = 0x4b;
      local_126 = 7;
      local_125 = 8;
      local_a8 = &local_dir_footer_size;
      zip_local._4_4_ = *(undefined4 *)&pzip[1].m_pAlloc;
      local_dir_footer_size._0_1_ = (undefined1)zip_local._4_4_;
      local_dir_footer_size._1_1_ = (undefined1)((uint)zip_local._4_4_ >> 8);
      local_dir_footer_size._2_1_ = (undefined1)((uint)zip_local._4_4_ >> 0x10);
      local_dir_footer_size._3_1_ = (undefined1)((uint)zip_local._4_4_ >> 0x18);
      local_58 = local_dir_footer;
      local_60 = pzip[1].m_file_offset_alignment;
      local_3c = (undefined4)local_60;
      local_dir_footer[0] = (mz_uint8)local_60;
      local_dir_footer[1] = (mz_uint8)(local_60 >> 8);
      local_dir_footer[2] = (mz_uint8)(local_60 >> 0x10);
      local_dir_footer[3] = (mz_uint8)(local_60 >> 0x18);
      local_48 = local_dir_footer + 4;
      local_4c = (undefined4)(local_60 >> 0x20);
      local_dir_footer[4] = (mz_uint8)(local_60 >> 0x20);
      local_dir_footer[5] = (mz_uint8)(local_60 >> 0x28);
      local_dir_footer[6] = (mz_uint8)(local_60 >> 0x30);
      local_dir_footer[7] = (mz_uint8)(local_60 >> 0x38);
      local_88 = local_dir_footer + 8;
      local_90._0_4_ = pzip[1].m_zip_type;
      local_90._4_4_ = pzip[1].m_last_error;
      local_dir_footer[8] = (mz_uint8)(undefined4)local_90;
      local_dir_footer[9] = (mz_uint8)((uint)(undefined4)local_90 >> 8);
      local_dir_footer[10] = (mz_uint8)((uint)(undefined4)local_90 >> 0x10);
      local_dir_footer[0xb] = (mz_uint8)((uint)(undefined4)local_90 >> 0x18);
      local_78 = local_dir_footer + 0xc;
      local_dir_footer[0xc] = (mz_uint8)local_90._4_4_;
      local_dir_footer[0xd] = (mz_uint8)((uint)local_90._4_4_ >> 8);
      local_dir_footer[0xe] = (mz_uint8)((uint)local_90._4_4_ >> 0x10);
      local_dir_footer[0xf] = (mz_uint8)((uint)local_90._4_4_ >> 0x18);
      local_7c = local_90._4_4_;
      local_6c = (undefined4)local_90;
      local_68 = local_88;
      local_38 = local_58;
      sVar7 = (*(_done->archive).m_pWrite)
                        ((_done->archive).m_pIO_opaque,(mz_uint64)pzip[1].m_pFree,&local_128,0x18);
      if (sVar7 == 0x18) {
        pzip[1].m_pFree = pzip[1].m_pFree + 0x18;
        uVar1._0_4_ = pzip[1].m_zip_type;
        uVar1._4_4_ = pzip[1].m_last_error;
        if (uVar1 < 0xffffffff) {
          local_140 = (mz_zip_type *)0x0;
        }
        else {
          local_140 = &pzip[1].m_zip_type;
        }
        if (pzip[1].m_file_offset_alignment < 0xffffffff) {
          local_150 = (mz_uint64 *)0x0;
        }
        else {
          local_150 = &pzip[1].m_file_offset_alignment;
        }
        if (pzip[1].m_pNeeds_keepalive < (mz_file_needs_keepalive)0xffffffff) {
          local_160 = (mz_file_needs_keepalive *)0x0;
        }
        else {
          local_160 = &pzip[1].m_pNeeds_keepalive;
        }
        mVar4 = mz_zip_writer_create_zip64_extra_data
                          (local_108,(mz_uint64 *)local_140,local_150,(mz_uint64 *)local_160);
        if ((err._2_2_ != 0) &&
           (((*(char *)(*(long *)&pzip[1].m_total_files + (long)(int)(err._2_2_ - 1)) == '/' ||
             (*(char *)(*(long *)&pzip[1].m_total_files + (long)(int)(err._2_2_ - 1)) == '\\')) &&
            (lVar2._0_4_ = pzip[1].m_zip_type, lVar2._4_4_ = pzip[1].m_last_error, lVar2 == 0)))) {
          *(uint *)&pzip[0xb25].m_pRealloc = *(uint *)&pzip[0xb25].m_pRealloc | 0x10;
        }
        uncomp_size._0_4_ = pzip[1].m_zip_type;
        uncomp_size._4_4_ = pzip[1].m_last_error;
        mVar5 = mz_zip_writer_add_to_central_dir
                          (&_done->archive,*(char **)&pzip[1].m_total_files,err._2_2_,local_108,
                           (mz_uint16)mVar4,"",0,uncomp_size,pzip[1].m_file_offset_alignment,
                           *(mz_uint32 *)&pzip[1].m_pAlloc,*(mz_uint16 *)&pzip[1].m_pIO_opaque,0x808
                           ,(mz_uint16)err,local_ce,(mz_uint64)pzip[1].m_pNeeds_keepalive,
                           *(mz_uint32 *)&pzip[0xb25].m_pRealloc,(char *)0x0,0);
        if (mVar5 == 0) {
          pExtra_data._4_4_ = -0xf;
        }
        else {
          (_done->archive).m_total_files = (_done->archive).m_total_files + 1;
          (_done->archive).m_archive_size = (mz_uint64)pzip[1].m_pFree;
        }
      }
      else {
        pExtra_data._4_4_ = -0xe;
      }
    }
  }
LAB_0011fc85:
  if (pzip != (mz_zip_archive *)0x0) {
    pzip[0xb25].m_pAlloc_opaque = (void *)0x0;
    pzip[1].m_central_directory_file_ofs = 0xffffffffffffffff;
    lVar3._0_4_ = pzip[1].m_total_files;
    lVar3._4_4_ = pzip[1].m_zip_mode;
    if (lVar3 != 0) {
      free(*(void **)&pzip[1].m_total_files);
      pzip[1].m_total_files = 0;
      pzip[1].m_zip_mode = MZ_ZIP_MODE_INVALID;
    }
  }
  return pExtra_data._4_4_;
}

Assistant:

int zip_entry_close(struct zip_t *zip) {
  mz_zip_archive *pzip = NULL;
  mz_uint level;
  tdefl_status done;
  mz_uint16 entrylen;
  mz_uint16 dos_time = 0, dos_date = 0;
  int err = 0;
  mz_uint8 *pExtra_data = NULL;
  mz_uint32 extra_size = 0;
  mz_uint8 extra_data[MZ_ZIP64_MAX_CENTRAL_EXTRA_FIELD_SIZE];
  mz_uint8 local_dir_footer[MZ_ZIP_DATA_DESCRIPTER_SIZE64];
  mz_uint32 local_dir_footer_size = MZ_ZIP_DATA_DESCRIPTER_SIZE64;

  if (!zip) {
    // zip_t handler is not initialized
    err = ZIP_ENOINIT;
    goto cleanup;
  }

  pzip = &(zip->archive);
  if (pzip->m_zip_mode == MZ_ZIP_MODE_READING) {
    goto cleanup;
  }

  level = zip->level & 0xF;
  if (level) {
    done = tdefl_compress_buffer(&(zip->entry.comp), "", 0, TDEFL_FINISH);
    if (done != TDEFL_STATUS_DONE && done != TDEFL_STATUS_OKAY) {
      // Cannot flush compressed buffer
      err = ZIP_ETDEFLBUF;
      goto cleanup;
    }
    zip->entry.comp_size = zip->entry.state.m_comp_size;
    zip->entry.dir_offset = zip->entry.state.m_cur_archive_file_ofs;
    zip->entry.method = MZ_DEFLATED;
  }

  entrylen = (mz_uint16)strlen(zip->entry.name);
#ifndef MINIZ_NO_TIME
  mz_zip_time_t_to_dos_time(zip->entry.m_time, &dos_time, &dos_date);
#endif

  MZ_WRITE_LE32(local_dir_footer + 0, MZ_ZIP_DATA_DESCRIPTOR_ID);
  MZ_WRITE_LE32(local_dir_footer + 4, zip->entry.uncomp_crc32);
  MZ_WRITE_LE64(local_dir_footer + 8, zip->entry.comp_size);
  MZ_WRITE_LE64(local_dir_footer + 16, zip->entry.uncomp_size);

  if (pzip->m_pWrite(pzip->m_pIO_opaque, zip->entry.dir_offset,
                     local_dir_footer,
                     local_dir_footer_size) != local_dir_footer_size) {
    // Cannot write zip entry header
    err = ZIP_EWRTHDR;
    goto cleanup;
  }
  zip->entry.dir_offset += local_dir_footer_size;

  pExtra_data = extra_data;
  extra_size = mz_zip_writer_create_zip64_extra_data(
      extra_data,
      (zip->entry.uncomp_size >= MZ_UINT32_MAX) ? &zip->entry.uncomp_size
                                                : NULL,
      (zip->entry.comp_size >= MZ_UINT32_MAX) ? &zip->entry.comp_size : NULL,
      (zip->entry.header_offset >= MZ_UINT32_MAX) ? &zip->entry.header_offset
                                                  : NULL);

  if ((entrylen) && ISSLASH(zip->entry.name[entrylen - 1]) &&
      !zip->entry.uncomp_size) {
    /* Set DOS Subdirectory attribute bit. */
    zip->entry.external_attr |= MZ_ZIP_DOS_DIR_ATTRIBUTE_BITFLAG;
  }

  if (!mz_zip_writer_add_to_central_dir(
          pzip, zip->entry.name, entrylen, pExtra_data, (mz_uint16)extra_size,
          "", 0, zip->entry.uncomp_size, zip->entry.comp_size,
          zip->entry.uncomp_crc32, zip->entry.method,
          MZ_ZIP_GENERAL_PURPOSE_BIT_FLAG_UTF8 |
              MZ_ZIP_LDH_BIT_FLAG_HAS_LOCATOR,
          dos_time, dos_date, zip->entry.header_offset,
          zip->entry.external_attr, NULL, 0)) {
    // Cannot write to zip central dir
    err = ZIP_EWRTDIR;
    goto cleanup;
  }

  pzip->m_total_files++;
  pzip->m_archive_size = zip->entry.dir_offset;

cleanup:
  if (zip) {
    zip->entry.m_time = 0;
    zip->entry.index = -1;
    CLEANUP(zip->entry.name);
  }
  return err;
}